

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O0

bool __thiscall crnlib::dds_comp::compress_init(dds_comp *this,crn_comp_params *params)

{
  bool bVar1;
  uint uVar2;
  pixel_format pVar3;
  mipmapped_texture *in_RSI;
  long in_RDI;
  bool hierarchical;
  mipmapped_texture *in_stack_000012f0;
  dds_comp *in_stack_000012f8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool local_1;
  
  clear((dds_comp *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  *(mipmapped_texture **)(in_RDI + 0xa8) = in_RSI;
  uVar2 = math::minimum<unsigned_int>
                    (*(uint *)(*(long *)(in_RDI + 0xa8) + 0xc),
                     *(uint *)(*(long *)(in_RDI + 0xa8) + 0x10));
  if ((uVar2 == 0) ||
     (uVar2 = math::maximum<unsigned_int>
                        (*(uint *)(*(long *)(in_RDI + 0xa8) + 0xc),
                         *(uint *)(*(long *)(in_RDI + 0xa8) + 0x10)), 0x1000 < uVar2)) {
    local_1 = false;
  }
  else {
    uVar2 = math::minimum<unsigned_int>
                      (*(uint *)(*(long *)(in_RDI + 0xa8) + 8),
                       *(uint *)(*(long *)(in_RDI + 0xa8) + 0x14));
    if (uVar2 == 0) {
      local_1 = false;
    }
    else {
      bVar1 = create_dds_tex(in_stack_000012f8,in_stack_000012f0);
      if (bVar1) {
        dxt_image::pack_params::init
                  ((pack_params *)(in_RDI + 0xb8),*(EVP_PKEY_CTX **)(in_RDI + 0xa8));
        if (in_RSI[0xc].m_name.m_pStr != (char *)0x0) {
          *(code **)(in_RDI + 0xd0) = progress_callback_func;
          *(mipmapped_texture **)(in_RDI + 0xd8) = in_RSI;
        }
        pVar3 = pixel_format_helpers::convert_crn_format_to_pixel_format
                          (*(crn_format *)(*(long *)(in_RDI + 0xa8) + 0x18));
        *(pixel_format *)(in_RDI + 0xb0) = pVar3;
        if (*(int *)(in_RDI + 0xb0) == 0) {
          local_1 = false;
        }
        else {
          if ((((*(int *)(in_RDI + 0xb0) == 0x31545844) &&
               (bVar1 = mipmapped_texture::has_alpha(in_RSI), bVar1)) &&
              ((*(byte *)(in_RDI + 0xcb) & 1) != 0)) &&
             ((*(uint *)(*(long *)(in_RDI + 0xa8) + 0x20) & 0x80) != 0)) {
            *(undefined4 *)(in_RDI + 0xb0) = 0x41315844;
          }
          uVar2 = task_pool::init((task_pool *)(in_RDI + 0xf0),
                                  (EVP_PKEY_CTX *)(ulong)*(uint *)(*(long *)(in_RDI + 0xa8) + 0x358)
                                 );
          if ((uVar2 & 1) == 0) {
            local_1 = false;
          }
          else {
            *(long *)(in_RDI + 0xe8) = in_RDI + 0xf0;
            qdxt1_params::init((qdxt1_params *)(in_RDI + 0x3b0),(EVP_PKEY_CTX *)(in_RDI + 0xb8));
            qdxt5_params::init((qdxt5_params *)(in_RDI + 0x9e0),(EVP_PKEY_CTX *)(in_RDI + 0xb8));
            local_1 = true;
          }
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool dds_comp::compress_init(const crn_comp_params& params) {
  clear();

  m_pParams = &params;

  if ((math::minimum(m_pParams->m_width, m_pParams->m_height) < 1) || (math::maximum(m_pParams->m_width, m_pParams->m_height) > cCRNMaxLevelResolution))
    return false;

  if (math::minimum(m_pParams->m_faces, m_pParams->m_levels) < 1)
    return false;

  if (!create_dds_tex(m_src_tex))
    return false;

  m_pack_params.init(*m_pParams);
  if (params.m_pProgress_func) {
    m_pack_params.m_pProgress_callback = progress_callback_func;
    m_pack_params.m_pProgress_callback_user_data_ptr = (void*)&params;
  }

  m_pixel_fmt = pixel_format_helpers::convert_crn_format_to_pixel_format(static_cast<crn_format>(m_pParams->m_format));
  if (m_pixel_fmt == PIXEL_FMT_INVALID)
    return false;
  if ((m_pixel_fmt == PIXEL_FMT_DXT1) && (m_src_tex.has_alpha()) && (m_pack_params.m_use_both_block_types) && (m_pParams->m_flags & cCRNCompFlagDXT1AForTransparency))
    m_pixel_fmt = PIXEL_FMT_DXT1A;

  if (!m_task_pool.init(m_pParams->m_num_helper_threads))
    return false;
  m_pack_params.m_pTask_pool = &m_task_pool;

  const bool hierarchical = (params.m_flags & cCRNCompFlagHierarchical) != 0;
  m_q1_params.init(m_pack_params, params.m_quality_level, hierarchical);
  m_q5_params.init(m_pack_params, params.m_quality_level, hierarchical);

  return true;
}